

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O3

TestCaseGroup * vkt::tessellation::createGeometryGridRenderScatterTests(TestContext *testCtx)

{
  TestNode *this;
  GridRenderTestCase *this_00;
  long lVar1;
  allocator<char> local_72;
  allocator<char> local_71;
  string *local_70 [2];
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"scatter","Scatter output primitives");
  lVar1 = 0x10;
  do {
    this_00 = (GridRenderTestCase *)operator_new(0x88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,
               *(char **)((long)&createGeometryGridRenderLimitsTests::cases[2].flags + lVar1),
               &local_71);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_60 + 0x10),*(char **)(&UNK_00d00ce8 + lVar1),&local_72);
    anon_unknown_1::GridRenderTestCase::GridRenderTestCase
              (this_00,testCtx,local_70[0],(string *)local_50._M_allocated_capacity,
               *(Flags *)((long)&createGeometryGridRenderScatterTests::cases[0].name + lVar1));
    tcu::TestNode::addChild(this,(TestNode *)this_00);
    if ((string *)local_50._M_allocated_capacity != (string *)&local_40) {
      operator_delete((void *)local_50._M_allocated_capacity,(ulong)(local_40._M_p + 1));
    }
    if (local_70[0] != (string *)local_60) {
      operator_delete(local_70[0],(ulong)(local_60._0_8_ + 1));
    }
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x58);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createGeometryGridRenderScatterTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "scatter", "Scatter output primitives"));

	static const TestCaseDescription cases[] =
	{
		{
			"geometry_scatter_instances",
			"Each geometry shader instance outputs its primitives far from other instances of the same execution",
			FLAG_GEOMETRY_SCATTER_INSTANCES
		},
		{
			"geometry_scatter_primitives",
			"Each geometry shader instance outputs its primitives far from other primitives of the same instance",
			FLAG_GEOMETRY_SCATTER_PRIMITIVES | FLAG_GEOMETRY_SEPARATE_PRIMITIVES
		},
		{
			"geometry_scatter_layers",
			"Each geometry shader instance outputs its primitives to multiple layers and far from other primitives of the same instance",
			FLAG_GEOMETRY_SCATTER_LAYERS | FLAG_GEOMETRY_SEPARATE_PRIMITIVES
		},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ++ndx)
		group->addChild(new GridRenderTestCase(testCtx, cases[ndx].name, cases[ndx].desc, cases[ndx].flags));

	return group.release();
}